

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O0

void Wlc_BlastSqrtNR(Gia_Man_t *pNew,int *pNum,int nNum,Vec_Int_t *vTmp,Vec_Int_t *vRes)

{
  int iLit0;
  int *pNew_00;
  int iVar1;
  int iVar2;
  int local_54;
  int SqrPrev;
  int Carry;
  int k;
  int i;
  int *pIn1;
  int *pRem;
  int *pSqr;
  Vec_Int_t *vRes_local;
  Vec_Int_t *vTmp_local;
  int *piStack_18;
  int nNum_local;
  int *pNum_local;
  Gia_Man_t *pNew_local;
  
  local_54 = 1;
  pSqr = &vRes->nCap;
  vRes_local = vTmp;
  vTmp_local._4_4_ = nNum;
  piStack_18 = pNum;
  pNum_local = (int *)pNew;
  if (nNum % 2 != 0) {
    __assert_fail("nNum % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcBlast.c"
                  ,0x31a,"void Wlc_BlastSqrtNR(Gia_Man_t *, int *, int, Vec_Int_t *, Vec_Int_t *)");
  }
  Vec_IntFill(vRes,nNum / 2,0);
  Vec_IntFill(vRes_local,vTmp_local._4_4_ << 1,0);
  pRem = Vec_IntArray((Vec_Int_t *)pSqr);
  pIn1 = Vec_IntArray(vRes_local);
  _k = pIn1 + vTmp_local._4_4_;
  Carry = 0;
  while( true ) {
    iLit0 = local_54;
    if (vTmp_local._4_4_ / 2 <= Carry) {
      Vec_IntReverseOrder((Vec_Int_t *)pSqr);
      return;
    }
    if (*_k != 0) break;
    for (SqrPrev = 1; SqrPrev < Carry; SqrPrev = SqrPrev + 1) {
      _k[SqrPrev] = 0;
    }
    for (SqrPrev = Carry; SBORROW4(SqrPrev,Carry * 2) != SqrPrev + Carry * -2 < 0;
        SqrPrev = SqrPrev + 1) {
      _k[SqrPrev] = pRem[SqrPrev - Carry];
    }
    iVar1 = Abc_LitNot(local_54);
    iVar2 = SqrPrev + 1;
    _k[SqrPrev] = iVar1;
    SqrPrev = SqrPrev + 2;
    _k[iVar2] = 1;
    if (SqrPrev != Carry * 2 + 2) {
      __assert_fail("k == 2*i+2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcBlast.c"
                    ,0x32a,"void Wlc_BlastSqrtNR(Gia_Man_t *, int *, int, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    pIn1[Carry << 1] = piStack_18[vTmp_local._4_4_ + Carry * -2 + -1];
    pIn1[Carry * 2 + 1] = piStack_18[vTmp_local._4_4_ + Carry * -2 + -2];
    for (SqrPrev = Carry * 2 + 1; pNew_00 = pNum_local, -1 < SqrPrev; SqrPrev = SqrPrev + -1) {
      iVar1 = Gia_ManHashXor((Gia_Man_t *)pNum_local,iLit0,_k[SqrPrev]);
      Wlc_BlastFullAdder((Gia_Man_t *)pNew_00,iVar1,pIn1[SqrPrev],local_54,&local_54,pIn1 + SqrPrev)
      ;
    }
    pRem[Carry] = local_54;
    Carry = Carry + 1;
  }
  __assert_fail("pIn1[0] == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcBlast.c"
                ,0x323,"void Wlc_BlastSqrtNR(Gia_Man_t *, int *, int, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

void Wlc_BlastSqrtNR( Gia_Man_t * pNew, int * pNum, int nNum, Vec_Int_t * vTmp, Vec_Int_t * vRes )
{
    int * pSqr, * pRem, * pIn1;
    int i, k, Carry = 1;
    assert( nNum % 2 == 0 );
    Vec_IntFill( vRes, nNum/2, 0 );
    Vec_IntFill( vTmp, 2*nNum, 0 );
    pSqr = Vec_IntArray( vRes );
    pRem = Vec_IntArray( vTmp );
    pIn1 = pRem + nNum;
    for ( i = 0; i < nNum/2; i++ )
    {
        int SqrPrev = Carry;
        assert( pIn1[0] == 0 );
        for ( k = 1; k < i; k++ )
            pIn1[k] = 0;
        for ( k = i; k < 2*i; k++ )
            pIn1[k] = pSqr[k-i];
        pIn1[k++] = Abc_LitNot(Carry);
        pIn1[k++] = 1;
        assert( k == 2*i+2 );
        pRem[2*i+0] = pNum[nNum-2*i-1];
        pRem[2*i+1] = pNum[nNum-2*i-2];
        for ( k = 2*i+1; k >= 0; k-- )
            Wlc_BlastFullAdder( pNew, Gia_ManHashXor(pNew, SqrPrev, pIn1[k]), pRem[k], Carry, &Carry, &pRem[k] );
        pSqr[i] = Carry;
    }
    Vec_IntReverseOrder( vRes );
}